

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzip_stream.cc
# Opt level: O0

int __thiscall google::protobuf::io::GzipOutputStream::Deflate(GzipOutputStream *this,int flush)

{
  uint uVar1;
  int v1;
  int v2;
  LogMessage *pLVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  LogMessageFatal local_48 [23];
  Voidify local_31;
  string *local_30;
  string *absl_log_internal_check_op_result;
  int local_20;
  int iStack_1c;
  bool ok;
  int error;
  int flush_local;
  GzipOutputStream *this_local;
  
  local_20 = 0;
  iStack_1c = flush;
  _error = this;
  do {
    if ((this->sub_data_ == (void *)0x0) || ((this->zcontext_).avail_out == 0)) {
      uVar1 = (*this->sub_stream_->_vptr_ZeroCopyOutputStream[2])
                        (this->sub_stream_,&this->sub_data_,&this->sub_data_size_);
      absl_log_internal_check_op_result._7_1_ = (byte)uVar1 & 1;
      if ((uVar1 & 1) == 0) {
        this->sub_data_ = (void *)0x0;
        this->sub_data_size_ = 0;
        return -5;
      }
      v1 = absl::lts_20240722::log_internal::GetReferenceableValue(this->sub_data_size_);
      v2 = absl::lts_20240722::log_internal::GetReferenceableValue(0);
      local_30 = absl::lts_20240722::log_internal::Check_GTImpl_abi_cxx11_
                           (v1,v2,"sub_data_size_ > 0");
      if (local_30 != (string *)0x0) {
        auVar4 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_30);
        absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                  (local_48,
                   "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/io/gzip_stream.cc"
                   ,0xf0,auVar4._0_8_,auVar4._8_8_);
        pLVar2 = absl::lts_20240722::log_internal::LogMessage::InternalStream
                           ((LogMessage *)local_48);
        absl::lts_20240722::log_internal::Voidify::operator&&(&local_31,pLVar2);
        absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_48);
      }
      (this->zcontext_).next_out = (Bytef *)this->sub_data_;
      (this->zcontext_).avail_out = this->sub_data_size_;
      local_30 = (string *)0x0;
    }
    local_20 = deflate(&this->zcontext_,iStack_1c);
    bVar3 = false;
    if (local_20 == 0) {
      bVar3 = (this->zcontext_).avail_out == 0;
    }
    if (!bVar3) {
      if ((iStack_1c == 3) || (iStack_1c == 4)) {
        (*this->sub_stream_->_vptr_ZeroCopyOutputStream[3])
                  (this->sub_stream_,(ulong)(this->zcontext_).avail_out);
        this->sub_data_ = (void *)0x0;
        this->sub_data_size_ = 0;
      }
      return local_20;
    }
  } while( true );
}

Assistant:

int GzipOutputStream::Deflate(int flush) {
  int error = Z_OK;
  do {
    if ((sub_data_ == NULL) || (zcontext_.avail_out == 0)) {
      bool ok = sub_stream_->Next(&sub_data_, &sub_data_size_);
      if (!ok) {
        sub_data_ = NULL;
        sub_data_size_ = 0;
        return Z_BUF_ERROR;
      }
      ABSL_CHECK_GT(sub_data_size_, 0);
      zcontext_.next_out = static_cast<Bytef*>(sub_data_);
      zcontext_.avail_out = sub_data_size_;
    }
    error = deflate(&zcontext_, flush);
  } while (error == Z_OK && zcontext_.avail_out == 0);
  if ((flush == Z_FULL_FLUSH) || (flush == Z_FINISH)) {
    // Notify lower layer of data.
    sub_stream_->BackUp(zcontext_.avail_out);
    // We don't own the buffer anymore.
    sub_data_ = NULL;
    sub_data_size_ = 0;
  }
  return error;
}